

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int should_keep_alive(mg_connection *conn)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  long lVar6;
  vec opt_vec;
  vec eq_vec;
  vec local_40;
  vec local_30;
  
  if (conn == (mg_connection *)0x0) {
    return 0;
  }
  if (conn->must_close != 0) {
    return 0;
  }
  pcVar5 = conn->dom_ctx->config[10];
  pp_Var4 = __ctype_tolower_loc();
  lVar6 = 0;
  do {
    bVar1 = pcVar5[lVar6];
    iVar3 = (*pp_Var4)[bVar1];
    iVar2 = (*pp_Var4)[(byte)"yes"[lVar6]];
    if (bVar1 == 0) break;
    lVar6 = lVar6 + 1;
  } while (iVar3 == iVar2);
  if (iVar3 != iVar2) {
    return 0;
  }
  pcVar5 = mg_get_header(conn,"Connection");
  if (pcVar5 != (char *)0x0) {
    do {
      pcVar5 = next_option(pcVar5,&local_40,&local_30);
      if (pcVar5 == (char *)0x0) break;
      iVar3 = mg_strncasecmp("keep-alive",local_40.ptr,local_40.len);
    } while (iVar3 != 0);
    return (uint)(pcVar5 != (char *)0x0);
  }
  if (conn->connection_type == 1) {
    lVar6 = 0x30;
  }
  else {
    if (conn->connection_type != 2) {
      pcVar5 = (char *)0x0;
      goto LAB_001183a6;
    }
    lVar6 = 0x4c8;
  }
  pcVar5 = *(char **)((conn->request_info).remote_addr + lVar6 + -0x48);
LAB_001183a6:
  if ((pcVar5 == (char *)0x0) || (iVar3 = strcmp(pcVar5,"1.1"), iVar3 != 0)) {
    iVar3 = 0;
  }
  else {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
should_keep_alive(const struct mg_connection *conn)
{
	const char *http_version;
	const char *header;

	/* First satisfy needs of the server */
	if ((conn == NULL) || conn->must_close) {
		/* Close, if civetweb framework needs to close */
		return 0;
	}

	if (mg_strcasecmp(conn->dom_ctx->config[ENABLE_KEEP_ALIVE], "yes") != 0) {
		/* Close, if keep alive is not enabled */
		return 0;
	}

	/* Check explicit wish of the client */
	header = mg_get_header(conn, "Connection");
	if (header) {
		/* If there is a connection header from the client, obey */
		if (header_has_option(header, "keep-alive")) {
			return 1;
		}
		return 0;
	}

	/* Use default of the standard */
	http_version = get_http_version(conn);
	if (http_version && (0 == strcmp(http_version, "1.1"))) {
		/* HTTP 1.1 default is keep alive */
		return 1;
	}

	/* HTTP 1.0 (and earlier) default is to close the connection */
	return 0;
}